

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::InlinePass::CreateReturnVar
          (InlinePass *this,Function *calleeFn,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *new_vars)

{
  IRContext *c;
  long *plVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t ty_id;
  uint32_t from;
  TypeManager *this_00;
  Type *pTVar4;
  undefined4 extraout_var;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> this_01;
  DecorationManager *pDVar5;
  undefined4 extraout_var_00;
  long lVar6;
  initializer_list<unsigned_int> init_list;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_b0;
  uint local_a4 [3];
  SmallVector<unsigned_int,_2UL> local_98;
  SmallVector<unsigned_int,_2UL> local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  uVar2 = Function::type_id(calleeFn);
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  pTVar4 = analysis::TypeManager::GetType(this_00,uVar2);
  iVar3 = (*pTVar4->_vptr_Type[5])(pTVar4);
  if (CONCAT44(extraout_var,iVar3) != 0) {
    __assert_fail("type_mgr->GetType(calleeTypeId)->AsVoid() == nullptr && \"Cannot create a return variable of type void.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp"
                  ,0xbf,
                  "uint32_t spvtools::opt::InlinePass::CreateReturnVar(Function *, std::vector<std::unique_ptr<Instruction>> *)"
                 );
  }
  ty_id = analysis::TypeManager::FindPointerToType(this_00,uVar2,Function);
  if (((ty_id != 0) || (ty_id = AddPointerToType(this,uVar2,Function), ty_id != 0)) &&
     (uVar2 = IRContext::TakeNextId((this->super_Pass).context_), uVar2 != 0)) {
    this_01.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          )operator_new(0x70);
    c = (this->super_Pass).context_;
    local_a4[0] = 7;
    init_list._M_len = 1;
    init_list._M_array = local_a4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list);
    local_a4[1] = 0x11;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,&local_70);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
               local_a4 + 1,&local_70);
    Instruction::Instruction
              ((Instruction *)
               this_01.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,c,OpVariable
               ,ty_id,uVar2,(OperandList *)&local_48);
    local_b0._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
         (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
         this_01.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48)
    ;
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
    std::
    vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                *)new_vars,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&local_b0);
    pDVar5 = Pass::get_decoration_mgr(&this->super_Pass);
    from = Function::result_id(calleeFn);
    analysis::DecorationManager::CloneDecorations(pDVar5,from,uVar2);
    pTVar4 = analysis::TypeManager::GetType(this_00,ty_id);
    iVar3 = (*pTVar4->_vptr_Type[0x1f])(pTVar4);
    plVar1 = *(long **)(CONCAT44(extraout_var_00,iVar3) + 0x28);
    lVar6 = (**(code **)(*plVar1 + 0x100))(plVar1);
    if ((lVar6 != 0) &&
       (lVar6 = (**(code **)(*plVar1 + 0x100))(plVar1), *(int *)(lVar6 + 0x30) == 0x14e5)) {
      pDVar5 = Pass::get_decoration_mgr(&this->super_Pass);
      analysis::DecorationManager::AddDecoration(pDVar5,uVar2,0x14ec);
    }
    if (local_b0._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl ==
        (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         )0x0) {
      return uVar2;
    }
    (**(code **)(*(long *)local_b0._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                8))();
    return uVar2;
  }
  return 0;
}

Assistant:

uint32_t InlinePass::CreateReturnVar(
    Function* calleeFn, std::vector<std::unique_ptr<Instruction>>* new_vars) {
  uint32_t returnVarId = 0;
  const uint32_t calleeTypeId = calleeFn->type_id();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  assert(type_mgr->GetType(calleeTypeId)->AsVoid() == nullptr &&
         "Cannot create a return variable of type void.");
  // Find or create ptr to callee return type.
  uint32_t returnVarTypeId =
      type_mgr->FindPointerToType(calleeTypeId, spv::StorageClass::Function);

  if (returnVarTypeId == 0) {
    returnVarTypeId =
        AddPointerToType(calleeTypeId, spv::StorageClass::Function);
    if (returnVarTypeId == 0) {
      return 0;
    }
  }

  // Add return var to new function scope variables.
  returnVarId = context()->TakeNextId();
  if (returnVarId == 0) {
    return 0;
  }

  std::unique_ptr<Instruction> var_inst(new Instruction(
      context(), spv::Op::OpVariable, returnVarTypeId, returnVarId,
      {{spv_operand_type_t::SPV_OPERAND_TYPE_STORAGE_CLASS,
        {(uint32_t)spv::StorageClass::Function}}}));
  new_vars->push_back(std::move(var_inst));
  get_decoration_mgr()->CloneDecorations(calleeFn->result_id(), returnVarId);

  // Decorate the return var with AliasedPointer if the storage class of the
  // pointee type is PhysicalStorageBuffer.
  auto const pointee_type =
      type_mgr->GetType(returnVarTypeId)->AsPointer()->pointee_type();
  if (pointee_type->AsPointer() != nullptr) {
    if (pointee_type->AsPointer()->storage_class() ==
        spv::StorageClass::PhysicalStorageBuffer) {
      get_decoration_mgr()->AddDecoration(
          returnVarId, uint32_t(spv::Decoration::AliasedPointer));
    }
  }

  return returnVarId;
}